

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_importedGrandchildUnitsNotCompatible_Test::TestBody
          (Units_importedGrandchildUnitsNotCompatible_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  char *pcVar6;
  AssertionResult local_290 [2];
  AssertHelper local_270 [8];
  Message local_268 [15];
  bool local_259;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_;
  string local_240 [39];
  allocator<char> local_219;
  string local_218 [32];
  undefined1 local_1f8 [8];
  UnitsPtr u3;
  string local_1e0 [39];
  allocator<char> local_1b9;
  string local_1b8 [32];
  undefined1 local_198 [8];
  UnitsPtr u2;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [32];
  undefined1 local_138 [8];
  UnitsPtr u1;
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [32];
  undefined1 local_d8 [8];
  UnitsPtr u0;
  string local_c0 [32];
  undefined1 local_a0 [8];
  ImportSourcePtr imp;
  string local_88 [32];
  undefined1 local_68 [8];
  UnitsPtr imported_units;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  ModelPtr model;
  Units_importedGrandchildUnitsNotCompatible_Test *this_local;
  
  model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"nurseryrhymes",&local_41);
  libcellml::Model::create((string *)local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"imported_units",
             (allocator<char> *)
             ((long)&imp.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Units::create((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&imp.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::ImportSource::create();
  peVar3 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"i_am_a_url",
             (allocator<char> *)
             ((long)&u0.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::ImportSource::setUrl((string *)peVar3);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&u0.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(peVar4 + 0x10));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"u0",&local_f9);
  libcellml::Units::create((string *)local_d8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"imported_units",
             (allocator<char> *)
             ((long)&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar4);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"u1",&local_159);
  libcellml::Units::create((string *)local_138);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_180,"u0",
             (allocator<char> *)
             ((long)&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar4);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,"u2",&local_1b9);
  libcellml::Units::create((string *)local_198);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e0,"u1",
             (allocator<char> *)
             ((long)&u3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar4);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&u3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_218,"u3",&local_219);
  libcellml::Units::create((string *)local_1f8);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator(&local_219);
  peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_240,"imported_units",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::Units::addUnit((string *)peVar4);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  libcellml::Model::addUnits((shared_ptr *)peVar5);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  libcellml::Model::addUnits((shared_ptr *)peVar5);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  libcellml::Model::addUnits((shared_ptr *)peVar5);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  libcellml::Model::addUnits((shared_ptr *)peVar5);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  libcellml::Model::addUnits((shared_ptr *)peVar5);
  bVar1 = libcellml::Units::compatible((shared_ptr *)local_198,(shared_ptr *)local_1f8);
  local_259 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_258,&local_259,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar2) {
    testing::Message::Message(local_268);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_290,local_258,"libcellml::Units::compatible(u2, u3)","true");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x992,pcVar6);
    testing::internal::AssertHelper::operator=(local_270,local_268);
    testing::internal::AssertHelper::~AssertHelper(local_270);
    std::__cxx11::string::~string((string *)local_290);
    testing::Message::~Message(local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_1f8);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_198);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_138);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_d8);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)local_a0);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_68);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_20);
  return;
}

Assistant:

TEST(Units, importedGrandchildUnitsNotCompatible)
{
    auto model = libcellml::Model::create("nurseryrhymes");

    auto imported_units = libcellml::Units::create("imported_units");
    auto imp = libcellml::ImportSource::create();
    imp->setUrl("i_am_a_url");
    imported_units->setImportSource(imp);

    auto u0 = libcellml::Units::create("u0");
    u0->addUnit("imported_units");

    auto u1 = libcellml::Units::create("u1");
    u1->addUnit("u0");

    auto u2 = libcellml::Units::create("u2");
    u2->addUnit("u1");

    auto u3 = libcellml::Units::create("u3");
    u3->addUnit("imported_units");

    model->addUnits(u0);
    model->addUnits(u1);
    model->addUnits(u2);
    model->addUnits(u3);
    model->addUnits(imported_units);

    // Expect false only because the first units "imported_units" is imported... otherwise it would be true.
    // Imports are not resolved during the compatibility/equivalence checking, so any comparisons which
    // have unresolved imports must return `false` as there's not enough information to confirm that they're
    // the same.
    EXPECT_FALSE(libcellml::Units::compatible(u2, u3));
}